

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  connectdata *conn_00;
  undefined2 uVar1;
  Curl_dns_entry *pCVar2;
  sockaddr **ppsVar3;
  uint16_t uVar4;
  uint remote_scope;
  if2ip_result_t iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  undefined8 uVar11;
  bool bVar12;
  size_t local_6e0;
  char **local_6d8;
  char *dest;
  char *source;
  char target [67];
  char *r;
  char *port_sep;
  char *port_start;
  char *ip_end;
  char *ip_start;
  size_t addrlen;
  char *addr;
  char buffer [256];
  _Bool possibly_non_local;
  unsigned_short port;
  unsigned_short port_max;
  Curl_dns_entry *pCStack_540;
  unsigned_short port_min;
  Curl_dns_entry *h;
  char *string_ftpport;
  char *host;
  int error;
  resolve_t rc;
  sockaddr_in6 *sa6;
  sockaddr_in *sa4;
  sockaddr *sa;
  char hbuf [1025];
  socklen_t local_fc;
  Curl_addrinfo *pCStack_f8;
  curl_socklen_t sslen;
  Curl_addrinfo *ai;
  Curl_addrinfo *res;
  Curl_sockaddr_storage ss;
  char myhost [47];
  curl_socket_t portsock;
  ftp_conn *ftpc;
  connectdata *conn;
  CURLcode result;
  ftpport fcmd_local;
  Curl_easy *data_local;
  
  conn._0_4_ = CURLE_OK;
  conn_00 = data->conn;
  stack0xffffffffffffffcc = 0xffffffff;
  memset((void *)((long)&ss.buffer + 0x78),0,0x2f);
  _error = (sockaddr_in6 *)&res;
  string_ftpport = (char *)0x0;
  h = (Curl_dns_entry *)(data->set).str[0xc];
  pCStack_540 = (Curl_dns_entry *)0x0;
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  buffer[0xfc] = '\0';
  buffer[0xfd] = '\0';
  buffer[0xf9] = '\x01';
  addrlen = 0;
  ppsVar3 = (sockaddr **)string_ftpport;
  sa6 = _error;
  sa4 = (sockaddr_in *)_error;
  if (((data->set).str[0xc] != (char *)0x0) &&
     (sVar7 = strlen((data->set).str[0xc]), ppsVar3 = (sockaddr **)string_ftpport, 1 < sVar7)) {
    sVar7 = strlen((char *)h);
    if (sVar7 < 0x2e) {
      local_6e0 = 0x2e;
    }
    else {
      local_6e0 = strlen((char *)h);
    }
    pCVar2 = h;
    addrlen = (size_t)(*Curl_ccalloc)(local_6e0 + 1,1);
    if ((char *)addrlen == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*(char *)&h->addr == '[') {
      pcVar8 = (char *)((long)&h->addr + 1);
      port_start = strchr((char *)h,0x5d);
      if (port_start != (char *)0x0) {
        strncpy((char *)addrlen,pcVar8,(long)port_start - (long)pcVar8);
      }
    }
    else if (*(char *)&h->addr == ':') {
      port_start = (char *)h;
    }
    else {
      port_start = strchr((char *)h,0x3a);
      if (port_start == (char *)0x0) {
        strcpy((char *)addrlen,(char *)h);
      }
      else {
        iVar6 = inet_pton(10,(char *)h,_error);
        if (iVar6 == 1) {
          buffer[0xfc] = '\0';
          buffer[0xfd] = '\0';
          buffer[0xfe] = '\0';
          buffer[0xff] = '\0';
          strcpy((char *)addrlen,(char *)h);
          port_start = (char *)0x0;
        }
        else {
          strncpy((char *)addrlen,(char *)h,(long)port_start - (long)pCVar2);
        }
      }
    }
    if ((port_start != (char *)0x0) && (pcVar8 = strchr(port_start,0x3a), pcVar8 != (char *)0x0)) {
      uVar9 = strtoul(pcVar8 + 1,(char **)0x0,10);
      buffer._254_2_ = curlx_ultous(uVar9);
      pcVar8 = strchr(pcVar8,0x2d);
      if (pcVar8 == (char *)0x0) {
        buffer[0xfc] = buffer[0xfe];
        buffer[0xfd] = buffer[0xff];
      }
      else {
        uVar9 = strtoul(pcVar8 + 1,(char **)0x0,10);
        buffer._252_2_ = curlx_ultous(uVar9);
      }
    }
    if ((ushort)buffer._252_2_ < (ushort)buffer._254_2_) {
      buffer[0xfc] = '\0';
      buffer[0xfd] = '\0';
      buffer[0xfe] = '\0';
      buffer[0xff] = '\0';
    }
    if (*(char *)addrlen == '\0') {
      string_ftpport = (char *)0x0;
      ppsVar3 = (sockaddr **)string_ftpport;
    }
    else {
      iVar6 = conn_00->ip_addr->ai_family;
      remote_scope = Curl_ipv6_scope(conn_00->ip_addr->ai_addr);
      iVar5 = Curl_if2ip(iVar6,remote_scope,conn_00->scope_id,(char *)addrlen,(char *)&sa,0x401);
      ppsVar3 = (sockaddr **)(char *)addrlen;
      if (iVar5 != IF2IP_NOT_FOUND) {
        if (iVar5 == IF2IP_AF_NOT_SUPPORTED) {
          return CURLE_FTP_PORT_FAILED;
        }
        ppsVar3 = (sockaddr **)string_ftpport;
        if (iVar5 == IF2IP_FOUND) {
          ppsVar3 = &sa;
        }
      }
    }
  }
  string_ftpport = (char *)ppsVar3;
  if (string_ftpport == (char *)0x0) {
    local_fc = 0x80;
    iVar6 = getsockname(conn_00->sock[0],(sockaddr *)sa4,&local_fc);
    if (iVar6 != 0) {
      piVar10 = __errno_location();
      pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
      Curl_failf(data,"getsockname() failed: %s",pcVar8);
      (*Curl_cfree)((void *)addrlen);
      return CURLE_FTP_PORT_FAILED;
    }
    if (sa4->sin_family == 10) {
      register0x00000000 = inet_ntop((uint)sa4->sin_family,&_error->sin6_addr,(char *)&sa,0x401);
    }
    else {
      register0x00000000 = inet_ntop((uint)sa4->sin_family,&sa6->sin6_flowinfo,(char *)&sa,0x401);
    }
    if (stack0xfffffffffffff980 == (char *)0x0) {
      return CURLE_FTP_PORT_FAILED;
    }
    string_ftpport = (char *)&sa;
    buffer[0xf9] = '\0';
  }
  host._4_4_ = Curl_resolv(data,string_ftpport,0,false,&stack0xfffffffffffffac0);
  if (pCStack_540 == (Curl_dns_entry *)0x0) {
    ai = (Curl_addrinfo *)0x0;
  }
  else {
    ai = pCStack_540->addr;
    Curl_resolv_unlock(data,pCStack_540);
  }
  if (ai == (Curl_addrinfo *)0x0) {
    Curl_failf(data,"failed to resolve the address provided to PORT: %s",string_ftpport);
    (*Curl_cfree)((void *)addrlen);
  }
  else {
    (*Curl_cfree)((void *)addrlen);
    string_ftpport = (char *)0x0;
    stack0xffffffffffffffcc = -1;
    host._0_4_ = 0;
    pCStack_f8 = ai;
    while ((pCStack_f8 != (Curl_addrinfo *)0x0 &&
           (conn._0_4_ = Curl_socket(data,pCStack_f8,(Curl_sockaddr_ex *)0x0,
                                     (curl_socket_t *)(myhost + 0x2c)), (CURLcode)conn != CURLE_OK))
          ) {
      piVar10 = __errno_location();
      host._0_4_ = *piVar10;
      pCStack_f8 = pCStack_f8->ai_next;
    }
    if (pCStack_f8 == (Curl_addrinfo *)0x0) {
      pcVar8 = Curl_strerror((int)host,(char *)&addr,0x100);
      Curl_failf(data,"socket failure: %s",pcVar8);
    }
    else {
      memcpy(sa4,pCStack_f8->ai_addr,(ulong)pCStack_f8->ai_addrlen);
      local_fc = pCStack_f8->ai_addrlen;
      buffer[0xfa] = buffer[0xfe];
      buffer[0xfb] = buffer[0xff];
      while ((ushort)buffer._250_2_ <= (ushort)buffer._252_2_) {
        if (sa4->sin_family == 2) {
          uVar4 = htons(buffer._250_2_);
          sa6->sin6_port = uVar4;
        }
        else {
          uVar4 = htons(buffer._250_2_);
          _error->sin6_port = uVar4;
        }
        iVar6 = bind(stack0xffffffffffffffcc,(sockaddr *)sa4,local_fc);
        if (iVar6 == 0) break;
        piVar10 = __errno_location();
        uVar1 = buffer._250_2_;
        host._0_4_ = *piVar10;
        if (((buffer[0xf9] & 1U) == 0) || ((int)host != 99)) {
          if (((int)host != 0x62) && ((int)host != 0xd)) {
            pcVar8 = Curl_strerror((int)host,(char *)&addr,0x100);
            Curl_failf(data,"bind(port=%hu) failed: %s",(ulong)(ushort)uVar1,pcVar8);
            Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
            return CURLE_FTP_PORT_FAILED;
          }
          buffer._250_2_ = buffer._250_2_ + 1;
        }
        else {
          pcVar8 = Curl_strerror(99,(char *)&addr,0x100);
          Curl_infof(data,"bind(port=%hu) on non-local address failed: %s",(ulong)(ushort)uVar1,
                     pcVar8);
          local_fc = 0x80;
          iVar6 = getsockname(conn_00->sock[0],(sockaddr *)sa4,&local_fc);
          if (iVar6 != 0) {
            piVar10 = __errno_location();
            pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
            Curl_failf(data,"getsockname() failed: %s",pcVar8);
            Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
            return CURLE_FTP_PORT_FAILED;
          }
          buffer[0xfa] = buffer[0xfe];
          buffer[0xfb] = buffer[0xff];
          buffer[0xf9] = '\0';
        }
      }
      if ((ushort)buffer._252_2_ < (ushort)buffer._250_2_) {
        Curl_failf(data,"bind() failed, we ran out of ports");
        Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
      }
      else {
        local_fc = 0x80;
        iVar6 = getsockname(stack0xffffffffffffffcc,(sockaddr *)sa4,&local_fc);
        if (iVar6 == 0) {
          iVar6 = listen(stack0xffffffffffffffcc,1);
          if (iVar6 == 0) {
            Curl_printable_address(pCStack_f8,(char *)&ss.buffer.sa_stor.__ss_align,0x2f);
            conn._4_4_ = fcmd;
            if (((*(uint *)&(conn_00->bits).field_0x4 >> 0x13 & 1) == 0) &&
               ((*(uint *)&(conn_00->bits).field_0x4 >> 0xc & 1) != 0)) {
              *(uint *)&(conn_00->bits).field_0x4 =
                   *(uint *)&(conn_00->bits).field_0x4 & 0xfff7ffff | 0x80000;
            }
            do {
              if (conn._4_4_ == DONE) goto LAB_00ab3b94;
              if ((((*(uint *)&(conn_00->bits).field_0x4 >> 0x13 & 1) != 0) || (conn._4_4_ != EPRT))
                 && ((conn._4_4_ != PORT || (sa4->sin_family == 2)))) {
                if (sa4->sin_family == 2) {
                  buffer._250_2_ = ntohs(sa6->sin6_port);
                }
                else {
                  if (sa4->sin_family != 10) goto LAB_00ab3b86;
                  buffer._250_2_ = ntohs(_error->sin6_port);
                }
                if (conn._4_4_ == EPRT) {
                  uVar11 = 2;
                  if (sa4->sin_family == 2) {
                    uVar11 = 1;
                  }
                  conn._0_4_ = Curl_pp_sendf(data,&(conn_00->proto).ftpc.pp,"%s |%d|%s|%hu|",
                                             ftp_state_use_port::mode,uVar11,
                                             (undefined1 *)((long)&ss.buffer + 0x78),
                                             (uint)(ushort)buffer._250_2_);
                  if ((CURLcode)conn != CURLE_OK) {
                    pcVar8 = curl_easy_strerror((CURLcode)conn);
                    Curl_failf(data,"Failure sending EPRT command: %s",pcVar8);
                    Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
                    (conn_00->proto).ftpc.count1 = 1;
                    _state(data,FTP_STOP);
                    return (CURLcode)conn;
                  }
                  goto LAB_00ab3b94;
                }
                if (conn._4_4_ == PORT) {
                  dest = (char *)&ss.buffer.sa_stor.__ss_align;
                  local_6d8 = &source;
                  while( true ) {
                    bVar12 = false;
                    if (dest != (char *)0x0) {
                      bVar12 = *dest != '\0';
                    }
                    if (!bVar12) break;
                    if (*dest == '.') {
                      *(undefined1 *)local_6d8 = 0x2c;
                    }
                    else {
                      *(char *)local_6d8 = *dest;
                    }
                    local_6d8 = (char **)((long)local_6d8 + 1);
                    dest = dest + 1;
                  }
                  *(undefined1 *)local_6d8 = 0;
                  curl_msnprintf((char *)local_6d8,0x14,",%d,%d",
                                 (ulong)(uint)((int)(uint)(ushort)buffer._250_2_ >> 8),
                                 (ulong)((ushort)buffer._250_2_ & 0xff));
                  conn._0_4_ = Curl_pp_sendf(data,&(conn_00->proto).ftpc.pp,"%s %s",0xe157a1,&source
                                            );
                  if ((CURLcode)conn != CURLE_OK) {
                    pcVar8 = curl_easy_strerror((CURLcode)conn);
                    Curl_failf(data,"Failure sending PORT command: %s",pcVar8);
                    Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
                    _state(data,FTP_STOP);
                    return (CURLcode)conn;
                  }
LAB_00ab3b94:
                  (conn_00->proto).ftpc.count1 = conn._4_4_;
                  close_secondarysocket(data,conn_00);
                  conn_00->sock[1] = stack0xffffffffffffffcc;
                  (conn_00->bits).tcpconnect[1] = true;
                  _state(data,FTP_PORT);
                  return (CURLcode)conn;
                }
              }
LAB_00ab3b86:
              conn._4_4_ = conn._4_4_ + PORT;
            } while( true );
          }
          piVar10 = __errno_location();
          pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
          Curl_failf(data,"socket failure: %s",pcVar8);
          Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
        }
        else {
          piVar10 = __errno_location();
          pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
          Curl_failf(data,"getsockname() failed: %s",pcVar8);
          Curl_closesocket(data,conn_00,stack0xffffffffffffffcc);
        }
      }
    }
  }
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen + 1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      ip_end = strchr(string_ftpport, ']');
      if(ip_end)
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            strcpy(addr, string_ftpport);
            ip_end = NULL; /* this got no port ! */
          }
          else
#endif
            /* (ipv4|domain|interface):port(-range) */
            strncpy(addr, string_ftpport, ip_end - ip_start);
        }
        else
          /* ipv4|interface */
          strcpy(addr, string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
#ifdef ENABLE_IPV6
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id,
#endif
                        addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r)
      return CURLE_FTP_PORT_FAILED;
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(data, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          Curl_closesocket(data, conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        Curl_closesocket(data, conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  close_secondarysocket(data, conn);

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(data, FTP_PORT);
  return result;
}